

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O2

void __thiscall duckdb::MiniZStreamWrapper::~MiniZStreamWrapper(MiniZStreamWrapper *this)

{
  ~MiniZStreamWrapper(this);
  operator_delete(this);
  return;
}

Assistant:

MiniZStreamWrapper::~MiniZStreamWrapper() {
	// avoid closing if destroyed during stack unwinding
	if (Exception::UncaughtException()) {
		return;
	}
	try {
		MiniZStreamWrapper::Close();
	} catch (...) { // NOLINT - cannot throw in exception
	}
}